

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * parseCommaSeparatedList<int>(string *str)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  int iVar3;
  string *str_00;
  string *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  string cur;
  stringstream stream;
  vector<int,_std::allocator<int>_> *parsed;
  undefined4 in_stack_fffffffffffffe0c;
  string local_1c0 [39];
  byte local_199;
  stringstream local_198 [408];
  
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_198,in_RSI,_Var2);
  local_199 = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0xc4fcf0);
  std::__cxx11::string::string(local_1c0);
  while( true ) {
    str_00 = (string *)
             std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_198,local_1c0,',');
    bVar1 = std::ios::operator_cast_to_bool
                      ((ios *)(&str_00->_M_dataplus + *(long *)(*(long *)str_00 + -0x18)));
    in_stack_fffffffffffffe0c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe0c);
    if (!bVar1) break;
    iVar3 = Lib::StringUtils::parse<int>(str_00);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)str_00,
               (value_type_conflict3 *)CONCAT44(in_stack_fffffffffffffe0c,iVar3));
  }
  local_199 = 1;
  std::__cxx11::string::~string(local_1c0);
  if ((local_199 & 1) == 0) {
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)in_RSI);
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::vector<A> parseCommaSeparatedList(std::string const& str)
{
  std::stringstream stream(str);
  std::vector<A> parsed;
  std::string cur;
  while (std::getline(stream, cur, ',')) {
    parsed.push_back(StringUtils::parse<A>(cur));
  }
  return parsed;
}